

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O2

void __thiscall HDualRow::choose_final(HDualRow *this)

{
  int *__x;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  int *piVar6;
  double *pdVar7;
  pointer piVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  pointer ppVar20;
  ulong uVar21;
  double *pdVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  int local_4c;
  double local_48;
  undefined8 uStack_40;
  
  uVar9 = rdtsc();
  uVar15 = (undefined4)((ulong)uVar9 >> 0x20);
  auVar11._4_4_ = uVar15;
  auVar11._0_4_ = uVar15;
  auVar11._8_4_ = 0;
  auVar24._0_12_ = auVar11 << 0x20;
  auVar24._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0xd] =
       (auVar24._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
  iVar2 = this->workCount;
  this->workCount = 0;
  local_48 = ABS(this->workDelta);
  dVar23 = this->workTheta * 10.0 + 1e-07;
  __x = &this->workCount;
  dVar26 = 0.0;
  iVar17 = 0;
  do {
    ppVar5 = (this->workData).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar6 = this->workMove;
    pdVar22 = this->workDual;
    pdVar7 = this->workRange;
    lVar19 = (long)iVar17;
    ppVar20 = ppVar5 + lVar19;
    for (; lVar19 < iVar2; lVar19 = lVar19 + 1) {
      iVar17 = ppVar20->first;
      dVar28 = ppVar20->second;
      if ((double)piVar6[iVar17] * pdVar22[iVar17] <= dVar23 * dVar28) {
        iVar3 = *__x;
        *__x = iVar3 + 1;
        iVar4 = ppVar5[iVar3].first;
        ppVar5[iVar3].first = ppVar20->first;
        ppVar20->first = iVar4;
        dVar29 = ppVar5[iVar3].second;
        ppVar5[iVar3].second = dVar28;
        ppVar20->second = dVar29;
        dVar26 = dVar26 + dVar28 * pdVar7[iVar17];
      }
      ppVar20 = ppVar20 + 1;
    }
    if (local_48 <= dVar26) break;
    dVar23 = dVar23 * 10.0;
    iVar17 = *__x;
  } while (iVar17 != iVar2);
  uStack_40 = 0;
  HTimer::recordFinish(&this->workModel->timer,0xd);
  uVar9 = rdtsc();
  uVar15 = (undefined4)((ulong)uVar9 >> 0x20);
  auVar12._4_4_ = uVar15;
  auVar12._0_4_ = uVar15;
  auVar12._8_4_ = 0;
  auVar25._0_12_ = auVar12 << 0x20;
  auVar25._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0xe] =
       (auVar25._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
  dVar23 = this->workModel->dblOption[2];
  uVar16 = this->workCount;
  this->workCount = 0;
  piVar8 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar8) {
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar8;
  }
  dVar26 = this->workTheta;
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->workGroup,&local_4c);
  uVar18 = *__x;
  dVar28 = 1e-12;
  while (dVar26 < 1e+18) {
    ppVar5 = (this->workData).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar6 = this->workMove;
    pdVar22 = this->workDual;
    pdVar7 = this->workRange;
    lVar19 = (long)(int)uVar18;
    ppVar20 = ppVar5 + lVar19;
    dVar29 = 1e+100;
    for (; lVar19 < (int)uVar16; lVar19 = lVar19 + 1) {
      iVar2 = ppVar20->first;
      dVar1 = ppVar20->second;
      dVar27 = (double)piVar6[iVar2] * pdVar22[iVar2];
      if (dVar27 <= dVar26 * dVar1) {
        iVar17 = *__x;
        *__x = iVar17 + 1;
        iVar3 = ppVar5[iVar17].first;
        ppVar5[iVar17].first = ppVar20->first;
        ppVar20->first = iVar3;
        dVar27 = ppVar5[iVar17].second;
        ppVar5[iVar17].second = dVar1;
        ppVar20->second = dVar27;
        dVar28 = dVar28 + dVar1 * pdVar7[iVar2];
      }
      else {
        dVar27 = dVar27 + dVar23;
        if (dVar27 < dVar29 * dVar1) {
          dVar29 = dVar27 / dVar1;
        }
      }
      ppVar20 = ppVar20 + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->workGroup,__x);
    uVar18 = *__x;
    if ((local_48 <= dVar28) || (dVar26 = dVar29, uVar18 == uVar16)) break;
  }
  ppVar5 = (this->workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar13 = 0;
  uVar14 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar14 = uVar13;
  }
  dVar23 = 0.0;
  for (; uVar14 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
    dVar26 = *(double *)((long)&ppVar5->second + uVar13);
    if (dVar26 <= dVar23) {
      dVar26 = dVar23;
    }
    dVar23 = dVar26;
  }
  dVar26 = 1.0;
  if (dVar23 * 0.1 <= 1.0) {
    dVar26 = dVar23 * 0.1;
  }
  piVar8 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar16 = (int)((ulong)((long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar8) >> 2)
                - 2; uVar14 = 0xffffffffffffffff, uVar13 = 0xffffffffffffffff, -1 < (int)uVar16;
      uVar16 = uVar16 - 1) {
    uVar14 = (ulong)uVar16;
    uVar21 = (ulong)piVar8[uVar14];
    pdVar22 = &ppVar5[uVar21].second;
    dVar23 = 0.0;
    uVar13 = 0xffffffffffffffff;
    for (; (long)uVar21 < (long)piVar8[uVar14 + 1]; uVar21 = uVar21 + 1) {
      dVar28 = *pdVar22;
      if (dVar28 <= dVar23) {
        if ((dVar23 == dVar28) && (!NAN(dVar23) && !NAN(dVar28))) {
          uVar10 = uVar21;
          if (this->workRand[ppVar5[(int)uVar13].first] <=
              this->workRand[((pair<int,_double> *)(pdVar22 + -1))->first]) {
            uVar10 = uVar13;
          }
          uVar13 = uVar10 & 0xffffffff;
        }
      }
      else {
        uVar13 = uVar21 & 0xffffffff;
        dVar23 = dVar28;
      }
      pdVar22 = pdVar22 + 2;
    }
    uVar13 = (ulong)(int)uVar13;
    if (dVar26 < ppVar5[uVar13].second) break;
  }
  iVar2 = ppVar5[uVar13].first;
  this->workPivot = iVar2;
  uVar21 = -(ulong)(this->workDelta < 0.0);
  piVar6 = this->workMove;
  dVar26 = (double)piVar6[iVar2];
  dVar23 = (double)(uVar21 & (ulong)-ppVar5[uVar13].second | ~uVar21 & (ulong)ppVar5[uVar13].second)
           * dVar26;
  this->workAlpha = dVar23;
  dVar23 = (double)(-(ulong)(0.0 < dVar26 * this->workDual[iVar2]) &
                   (ulong)(this->workDual[iVar2] / dVar23));
  this->workTheta = dVar23;
  this->workCount = 0;
  pdVar22 = this->workRange;
  uVar13 = 0;
  ppVar20 = ppVar5;
  while ((long)uVar13 < (long)piVar8[uVar14]) {
    iVar2 = ppVar20->first;
    iVar17 = piVar6[iVar2];
    dVar26 = pdVar22[iVar2];
    uVar13 = uVar13 + 1;
    *__x = (int)uVar13;
    ppVar20->first = iVar2;
    ppVar20->second = (double)iVar17 * dVar26;
    ppVar20 = ppVar20 + 1;
  }
  if ((dVar23 == 0.0) && (!NAN(dVar23))) {
    *__x = 0;
    uVar13 = 0;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (ppVar5,ppVar5 + (uVar13 & 0xffffffff));
  HTimer::recordFinish(&this->workModel->timer,0xe);
  return;
}

Assistant:

void HDualRow::choose_final() {
    /**
     * This routine choose the dual entering variable by
     * BFRT and EXPAND. (In sequential)
     *
     * It will
     * (1) reduce the candidates as a small collection
     * (2) choose by BFRT by going over break points
     * (3) choose final by alpha
     * (4) determine final flip variables
     */

    // 1. Reduce by large step BFRT
    workModel->timer.recordStart(HTICK_CHUZC2);
    int fullCount = workCount;
    workCount = 0;
    double totalChange = 0;
    double totalDelta = fabs(workDelta);
    double selectTheta = 10 * workTheta + 1e-7;
    for (;;) {
        for (int i = workCount; i < fullCount; i++) {
            int iCol = workData[i].first;
            double alpha = workData[i].second;
            double tight = workMove[iCol] * workDual[iCol];
            if (alpha * selectTheta >= tight) {
                swap(workData[workCount++], workData[i]);
                totalChange += workRange[iCol] * alpha;
            }
        }
        selectTheta *= 10;
        if (totalChange >= totalDelta || workCount == fullCount)
            break;
    }
    workModel->timer.recordFinish(HTICK_CHUZC2);

    // 2. Choose by small step BFRT
    workModel->timer.recordStart(HTICK_CHUZC3);
    const double Td = workModel->dblOption[DBLOPT_DUAL_TOL];
    fullCount = workCount;
    workCount = 0;
    totalChange = 1e-12;
    selectTheta = workTheta;
    workGroup.clear();
    workGroup.push_back(0);
    while (selectTheta < 1e18) {
        double remainTheta = 1e100;
        for (int i = workCount; i < fullCount; i++) {
            int iCol = workData[i].first;
            double value = workData[i].second;
            double dual = workMove[iCol] * workDual[iCol];
            // Tight satisfy
            if (dual <= selectTheta * value) {
                swap(workData[workCount++], workData[i]);
                totalChange += value * (workRange[iCol]);
            } else if (dual + Td < remainTheta * value) {
                remainTheta = (dual + Td) / value;
            }
        }
        workGroup.push_back(workCount);
        selectTheta = remainTheta;
        if (totalChange >= totalDelta || workCount == fullCount)
            break;
    }

    // 3. Choose large alpha
    double finalCompare = 0;
    for (int i = 0; i < workCount; i++)
        finalCompare = max(finalCompare, workData[i].second);
    finalCompare = min(0.1 * finalCompare, 1.0);
    int countGroup = workGroup.size() - 1;
    int breakGroup = -1;
    int breakIndex = -1;
    for (int iGroup = countGroup - 1; iGroup >= 0; iGroup--) {
        double dMaxFinal = 0;
        int iMaxFinal = -1;
        for (int i = workGroup[iGroup]; i < workGroup[iGroup + 1]; i++) {
            if (dMaxFinal < workData[i].second) {
                dMaxFinal = workData[i].second;
                iMaxFinal = i;
            } else if (dMaxFinal == workData[i].second) {
                int jCol = workData[iMaxFinal].first;
                int iCol = workData[i].first;
                if (workRand[iCol] < workRand[jCol]) {
                    iMaxFinal = i;
                }
            }
        }

        if (workData[iMaxFinal].second > finalCompare) {
            breakIndex = iMaxFinal;
            breakGroup = iGroup;
            break;
        }

    }

    int sourceOut = workDelta < 0 ? -1 : 1;
    workPivot = workData[breakIndex].first;
    workAlpha = workData[breakIndex].second * sourceOut * workMove[workPivot];
    if (workDual[workPivot] * workMove[workPivot] > 0)
        workTheta = workDual[workPivot] / workAlpha;
    else
        workTheta = 0;

    // 4. Determine BFRT flip index: flip all
    fullCount = breakIndex;
    workCount = 0;
    for (int i = 0; i < workGroup[breakGroup]; i++) {
        const int iCol = workData[i].first;
        const int move = workMove[iCol];
        workData[workCount++] = make_pair(iCol, move * workRange[iCol]);
    }
    if (workTheta == 0)
        workCount = 0;
    sort(workData.begin(), workData.begin() + workCount);
    workModel->timer.recordFinish(HTICK_CHUZC3);
}